

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeEstimatorUtils.cpp
# Opt level: O3

bool checkValidMeasurement(Vector3 *in,string *measurement_type,bool check_also_zero_vector)

{
  double dVar1;
  pointer pcVar2;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_30 [2];
  long local_20 [2];
  
  dVar1 = in->m_data[0];
  if ((((((int)CONCAT71(in_register_00000011,check_also_zero_vector) == 0) || (dVar1 != 0.0)) ||
       (NAN(dVar1))) || ((in->m_data[1] != 0.0 || (NAN(in->m_data[1]))))) ||
     ((in->m_data[2] != 0.0 || (NAN(in->m_data[2]))))) {
    if (((!NAN(dVar1)) && (!NAN(in->m_data[1]))) && (!NAN(in->m_data[2]))) {
      return true;
    }
    local_30[0] = local_20;
    pcVar2 = (measurement_type->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_30,pcVar2,pcVar2 + measurement_type->_M_string_length);
    std::__cxx11::string::append((char *)local_30);
    iDynTree::reportError("AttitudeEstimator","checkValidMeasurement",(char *)local_30[0]);
  }
  else {
    local_30[0] = local_20;
    pcVar2 = (measurement_type->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_30,pcVar2,pcVar2 + measurement_type->_M_string_length);
    std::__cxx11::string::append((char *)local_30);
    iDynTree::reportError("AttitudeEstimator","checkValidMeasurement",(char *)local_30[0]);
  }
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return false;
}

Assistant:

bool checkValidMeasurement(const iDynTree::Vector3& in, const std::string& measurement_type, bool check_also_zero_vector)
{
    if (check_also_zero_vector)
    {
        if (isZeroVector(in))
        {
            iDynTree::reportError("AttitudeEstimator", "checkValidMeasurement",
                                  (measurement_type + " measurements are invalid. Expecting a non-zero vector.").c_str());
            return false;
        }
    }

    if (isVectorNaN(in))
    {
        iDynTree::reportError("AttitudeEstimator", "checkValidMeasurement",
                              (measurement_type + " measurements are invalid. Has NaN elements.").c_str());
        return false;
    }

    return true;
}